

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitArrayInitElem
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          ArrayInitElem *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  element_type *peVar3;
  ulong uVar4;
  size_type sVar5;
  size_type sVar6;
  reference ppEVar7;
  Literal *pLVar8;
  Literal *this_00;
  Name NVar9;
  Flow local_200;
  ulong local_1b8;
  size_t i;
  unsigned_long max;
  undefined8 uStack_1a0;
  long local_190;
  ElementSegment *seg;
  Module *wasm;
  size_t arraySize;
  size_t sizeVal;
  size_t offsetVal;
  size_t indexVal;
  shared_ptr<wasm::GCData> data;
  Flow size;
  Flow offset;
  Flow index;
  undefined1 local_68 [8];
  Flow ref;
  ArrayInitElem *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&offset.breakTo.super_IString.str._M_str,pEVar2,
               *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&offset.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&offset.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar2,
                 *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x30));
      bVar1 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
      }
      else {
        pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
        ExpressionRunner<wasm::ModuleRunner>::visit
                  ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,pEVar2,
                   *(Expression **)(ref.breakTo.super_IString.str._M_str + 0x38));
        bVar1 = Flow::breaking((Flow *)&data.
                                        super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
        if (bVar1) {
          Flow::Flow(__return_storage_ptr__,
                     (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
        }
        else {
          Flow::getSingleValue((Flow *)local_68);
          ::wasm::Literal::getGCData();
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&indexVal);
          if (!bVar1) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"null ref");
          }
          Flow::getSingleValue((Flow *)&offset.breakTo.super_IString.str._M_str);
          offsetVal = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
          sizeVal = ::wasm::Literal::getUnsigned();
          Flow::getSingleValue
                    ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          arraySize = ::wasm::Literal::getUnsigned();
          peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&indexVal);
          wasm = (Module *)
                 SmallVector<wasm::Literal,_1UL>::size
                           (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>);
          if (wasm < (Module *)(offsetVal + arraySize)) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds array access in array.init");
          }
          pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
          seg = (ElementSegment *)ExpressionRunner<wasm::ModuleRunner>::getModule(pEVar2);
          max = *(unsigned_long *)(ref.breakTo.super_IString.str._M_str + 0x10);
          uStack_1a0 = *(undefined8 *)(ref.breakTo.super_IString.str._M_str + 0x18);
          NVar9.super_IString.str._M_str = (char *)max;
          NVar9.super_IString.str._M_len = (size_t)seg;
          local_190 = ::wasm::Module::getElementSegment(NVar9);
          uVar4 = sizeVal + arraySize;
          i = uVar4;
          sVar5 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             (local_190 + 0x38));
          if (sVar5 < uVar4) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in array.init_elem");
          }
          if (i != 0) {
            sVar6 = std::
                    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::count(&this->droppedElementSegments,
                            (key_type *)(ref.breakTo.super_IString.str._M_str + 0x10));
            if (sVar6 != 0) {
              (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                        (this,"out of bounds segment access in array.init_elem");
            }
          }
          for (local_1b8 = 0; local_1b8 < arraySize; local_1b8 = local_1b8 + 1) {
            pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
            ppEVar7 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::
                      operator[]((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 (local_190 + 0x38),local_1b8);
            ExpressionRunner<wasm::ModuleRunner>::visit(&local_200,pEVar2,*ppEVar7);
            pLVar8 = Flow::getSingleValue(&local_200);
            peVar3 = std::
                     __shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&indexVal);
            this_00 = SmallVector<wasm::Literal,_1UL>::operator[]
                                (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,
                                 offsetVal + local_1b8);
            ::wasm::Literal::operator=(this_00,pLVar8);
            Flow::~Flow(&local_200);
          }
          Flow::Flow(__return_storage_ptr__);
          std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&indexVal);
        }
        Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      }
      Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&offset.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayInitElem(ArrayInitElem* curr) {
    NOTE_ENTER("ArrayInit");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow index = self()->visit(curr->index);
    if (index.breaking()) {
      return index;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    size_t indexVal = index.getSingleValue().getUnsigned();
    size_t offsetVal = offset.getSingleValue().getUnsigned();
    size_t sizeVal = size.getSingleValue().getUnsigned();

    size_t arraySize = data->values.size();
    if ((uint64_t)indexVal + sizeVal > arraySize) {
      trap("out of bounds array access in array.init");
    }

    Module& wasm = *self()->getModule();

    auto* seg = wasm.getElementSegment(curr->segment);
    auto max = (uint64_t)offsetVal + sizeVal;
    if (max > seg->data.size()) {
      trap("out of bounds segment access in array.init_elem");
    }
    if (max > 0 && droppedElementSegments.count(curr->segment)) {
      trap("out of bounds segment access in array.init_elem");
    }
    for (size_t i = 0; i < sizeVal; i++) {
      // TODO: This is not correct because it does not preserve the identity
      // of references in the table! ArrayNew suffers the same problem.
      // Fixing it will require changing how we represent segments, at least
      // in the interpreter.
      data->values[indexVal + i] = self()->visit(seg->data[i]).getSingleValue();
    }
    return {};
  }